

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O0

void PatchRandoWorldEdits::put_orcs_back_in_room_before_boss_swamp_shrine(World *world)

{
  Map *pMVar1;
  vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_> *this;
  Entity *pEVar2;
  vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> *pvVar3;
  EntityMaskFlag local_30;
  EntityMaskFlag local_20;
  World *local_10;
  World *world_local;
  
  local_10 = world;
  pMVar1 = World::map(world,0x1e);
  this = Map::global_entity_mask_flags(pMVar1);
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::clear(this);
  pMVar1 = World::map(local_10,0x1e);
  Map::remove_entity(pMVar1,'\x05',true);
  pMVar1 = World::map(local_10,0x1e);
  pEVar2 = Map::entity(pMVar1,'\x01');
  pvVar3 = Entity::mask_flags(pEVar2);
  EntityMaskFlag::EntityMaskFlag(&local_20,false,'\x02','\x05');
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
            (pvVar3,&local_20);
  pMVar1 = World::map(local_10,0x1e);
  pEVar2 = Map::entity(pMVar1,'\x02');
  pvVar3 = Entity::mask_flags(pEVar2);
  EntityMaskFlag::EntityMaskFlag(&local_30,false,'\x02','\x05');
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
            (pvVar3,&local_30);
  return;
}

Assistant:

static void put_orcs_back_in_room_before_boss_swamp_shrine(World& world)
    {
        // In map before boss, put the orcs back and only remove the locked door
        world.map(MAP_SWAMP_SHRINE_ROOM_BEFORE_BOSS)->global_entity_mask_flags().clear();
        world.map(MAP_SWAMP_SHRINE_ROOM_BEFORE_BOSS)->remove_entity(5);
        // Remove the door orcs if Fara has been freed
        world.map(MAP_SWAMP_SHRINE_ROOM_BEFORE_BOSS)->entity(1)->mask_flags().emplace_back(EntityMaskFlag(false, 2, 5));
        world.map(MAP_SWAMP_SHRINE_ROOM_BEFORE_BOSS)->entity(2)->mask_flags().emplace_back(EntityMaskFlag(false, 2, 5));
    }